

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-ttl.c
# Opt level: O0

int run_test_udp_multicast_ttl(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  char *local_1c8;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  uv_buf_t buf;
  uv_udp_send_t req;
  int r;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&server);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x3f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("0.0.0.0",0,(sockaddr_in *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x41,"uv_ip4_addr(\"0.0.0.0\", 0, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_bind(&server,(sockaddr *)&eval_a,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x43,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_set_multicast_ttl(&server,0x20);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x46,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar3 = uv_buf_init("PING",4);
  eval_a_4 = (int64_t)uVar3.base;
  addr.sin_zero[0] = (undefined1)eval_a_4;
  addr.sin_zero[1] = eval_a_4._1_1_;
  addr.sin_zero[2] = eval_a_4._2_1_;
  addr.sin_zero[3] = eval_a_4._3_1_;
  addr.sin_zero[4] = eval_a_4._4_1_;
  addr.sin_zero[5] = eval_a_4._5_1_;
  addr.sin_zero[6] = eval_a_4._6_1_;
  addr.sin_zero[7] = eval_a_4._7_1_;
  local_1c8 = (char *)uVar3.len;
  buf.base = local_1c8;
  iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,(sockaddr_in *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x4a,"uv_ip4_addr(\"239.255.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_send((uv_udp_send_t *)&buf.len,&server,(uv_buf_t *)addr.sin_zero,1,
                      (sockaddr *)&eval_a,sv_send_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x51,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x53,"close_cb_called","==","0",(long)close_cb_called,"==",0);
    abort();
  }
  if ((long)sv_send_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x54,"sv_send_cb_called","==","0",(long)sv_send_cb_called,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)sv_send_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x59,"1","==","sv_send_cb_called",1,"==",(long)sv_send_cb_called);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x5a,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-ttl.c"
            ,0x5c,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_multicast_ttl) {
  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("0.0.0.0", 0, &addr));
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_set_multicast_ttl(&server, 32);
  ASSERT_OK(r);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  ASSERT_OK(uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  sv_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}